

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O2

void __thiscall random_tests::randbits_test::test_method(randbits_test *this)

{
  unsigned_long uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  pointer ppVar4;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  int bit;
  pointer ppVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  iterator in_R8;
  uint64_t *in_R9;
  int bits;
  int iVar15;
  pointer ppVar16;
  long in_FS_OFFSET;
  double dVar17;
  double dVar18;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined4 local_284;
  ulong local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined **local_238;
  undefined1 local_230;
  undefined1 *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  uint64_t gen2;
  uint64_t gen;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  seen;
  FastRandomContext ctx_test2;
  FastRandomContext ctx_test1;
  FastRandomContext ctx_lens;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar15 = 0;
  FastRandomContext::FastRandomContext(&ctx_lens,false);
  FastRandomContext::FastRandomContext(&ctx_test1,true);
  FastRandomContext::FastRandomContext(&ctx_test2,true);
  iVar6 = 0;
LAB_0044dce5:
  if (iVar15 == 5) {
    ChaCha20::~ChaCha20(&ctx_test2.rng);
    ChaCha20::~ChaCha20(&ctx_test1.rng);
    ChaCha20::~ChaCha20(&ctx_lens.rng);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
      __stack_chk_fail();
    }
    return;
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&seen,0x20800,(allocator_type *)&local_238);
  iVar11 = 0;
  do {
    ppVar4 = seen.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (ppVar8 = seen.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar13 = (long)seen.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)seen.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
          lVar14 = (long)seen.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)seen.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 6, iVar11 == 1000) {
      for (; ppVar16 = seen.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start, 0 < lVar14; lVar14 = lVar14 + -1)
      {
        if (ppVar8->first < 0xf2) goto LAB_0044ddc7;
        if (ppVar8[1].first < 0xf2) {
          ppVar8 = ppVar8 + 1;
          goto LAB_0044ddc7;
        }
        if (ppVar8[2].first < 0xf2) {
          ppVar8 = ppVar8 + 2;
          goto LAB_0044ddc7;
        }
        if (ppVar8[3].first < 0xf2) {
          ppVar8 = ppVar8 + 3;
          goto LAB_0044ddc7;
        }
        ppVar8 = ppVar8 + 4;
        lVar13 = lVar13 + -0x40;
      }
      lVar13 = lVar13 >> 4;
      if (lVar13 == 1) {
LAB_0044ddaa:
        if (0xf1 < ppVar8->first) {
          ppVar8 = seen.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else if (lVar13 == 2) {
LAB_0044dd9d:
        if (0xf1 < ppVar8->first) {
          ppVar8 = ppVar8 + 1;
          goto LAB_0044ddaa;
        }
      }
      else {
        if (lVar13 != 3) goto LAB_0044e16e;
        if (0xf1 < ppVar8->first) {
          ppVar8 = ppVar8 + 1;
          goto LAB_0044dd9d;
        }
      }
LAB_0044ddc7:
      iVar11 = 0;
      if (ppVar8 == seen.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0044e16e;
    }
    uVar7 = FastRandomContext::rand64(&ctx_lens);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    auVar3 = auVar3 % ZEXT816(0x41);
    uVar9 = auVar3._0_8_;
    bits = auVar3._0_4_;
    gen = RandomMixin<FastRandomContext>::randbits
                    (&ctx_test1.super_RandomMixin<FastRandomContext>,bits);
    if (uVar9 == 0x40) {
      gen2 = FastRandomContext::rand64(&ctx_test2);
    }
    else if (uVar9 == 1) {
      gen2 = RandomMixin<FastRandomContext>::randbits<1>
                       (&ctx_test2.super_RandomMixin<FastRandomContext>);
    }
    else if (uVar9 == 7) {
      gen2 = RandomMixin<FastRandomContext>::randbits<7>
                       (&ctx_test2.super_RandomMixin<FastRandomContext>);
    }
    else if (uVar9 == 0x20) {
      gen2 = RandomMixin<FastRandomContext>::randbits<32>
                       (&ctx_test2.super_RandomMixin<FastRandomContext>);
    }
    else if (uVar9 == 0x33) {
      gen2 = RandomMixin<FastRandomContext>::randbits<51>
                       (&ctx_test2.super_RandomMixin<FastRandomContext>);
    }
    else if (uVar9 == 0) {
      gen2 = RandomMixin<FastRandomContext>::randbits<0>
                       (&ctx_test2.super_RandomMixin<FastRandomContext>);
    }
    else {
      gen2 = RandomMixin<FastRandomContext>::randbits
                       (&ctx_test2.super_RandomMixin<FastRandomContext>,bits);
    }
    local_208 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
    ;
    local_200 = "";
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xa7;
    file.m_begin = (iterator)&local_208;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
    local_230 = 0;
    local_238 = &PTR__lazy_ostream_011480b0;
    local_228 = boost::unit_test::lazy_ostream::inst;
    local_220 = "";
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
    ;
    local_240 = "";
    in_R8 = (iterator)0x2;
    in_R9 = &gen;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_238,&local_248,0xa7,1,2,in_R9,"gen",&gen2,"gen2");
    if (uVar9 < 0x40) {
      local_258 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_250 = "";
      local_268 = &boost::unit_test::basic_cstring<char_const>::null;
      local_260 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xa9;
      file_00.m_begin = (iterator)&local_258;
      msg_00.m_end = (iterator)in_R9;
      msg_00.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_268,
                 msg_00);
      local_230 = 0;
      local_238 = &PTR__lazy_ostream_011480b0;
      local_228 = boost::unit_test::lazy_ostream::inst;
      local_220 = "";
      local_278 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_270 = "";
      local_280 = gen >> (auVar3[0] & 0x3f);
      local_284 = 0;
      in_R8 = (iterator)0x2;
      in_R9 = &local_280;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                (&local_238,&local_278,0xa9,1,2,in_R9,"gen >> bits",&local_284,"0");
    }
    uVar5 = (bits + -1) * bits;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      iVar12 = iVar6 * 0x820 +
               (int)(short)((int)((uint)(ushort)((short)uVar5 >> 0xf) << 0x10 | uVar5 & 0xffff) / 2)
               + (int)uVar10;
      seen.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar12].first =
           seen.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar12].first + 1;
      seen.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar12].second =
           seen.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar12].second +
           (ulong)((gen >> (uVar10 & 0x3f) & 1) != 0);
    }
    iVar12 = iVar6 + 0x40;
    if (bits <= iVar6) {
      iVar12 = iVar6;
    }
    iVar6 = iVar12 - bits;
    iVar11 = iVar11 + 1;
  } while( true );
LAB_0044e16e:
  while (ppVar16 != ppVar4) {
    dVar17 = ((double)CONCAT44(0x45300000,(int)(ppVar16->first >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)ppVar16->first) - 4503599627370496.0);
    uVar1 = ppVar16->second;
    dVar18 = dVar17 * 0.25;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    ppVar16 = ppVar16 + 1;
    if (dVar18 * 7.78 <=
        ABS(dVar17 * 0.5 -
            (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)))) {
      __assert_fail("fabs(val.first * 0.5 - val.second) < sqrt(val.first * 0.25) * 7.78",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
                    ,0xbd,"void random_tests::randbits_test::test_method()");
    }
  }
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&seen.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  iVar15 = iVar15 + 1;
  goto LAB_0044dce5;
}

Assistant:

BOOST_AUTO_TEST_CASE(randbits_test)
{
    FastRandomContext ctx_lens; //!< RNG for producing the lengths requested from ctx_test.
    FastRandomContext ctx_test1(true), ctx_test2(true); //!< The RNGs being tested.
    int ctx_test_bitsleft{0}; //!< (Assumed value of) ctx_test::bitbuf_len

    // Run the entire test 5 times.
    for (int i = 0; i < 5; ++i) {
        // count (first) how often it has occurred, and (second) how often it was true:
        // - for every bit position, in every requested bits count (0 + 1 + 2 + ... + 64 = 2080)
        // - for every value of ctx_test_bitsleft (0..63 = 64)
        std::vector<std::pair<uint64_t, uint64_t>> seen(2080 * 64);
        while (true) {
            // Loop 1000 times, just to not continuously check std::all_of.
            for (int j = 0; j < 1000; ++j) {
                // Decide on a number of bits to request (0 through 64, inclusive; don't use randbits/randrange).
                int bits = ctx_lens.rand64() % 65;
                // Generate that many bits.
                uint64_t gen = ctx_test1.randbits(bits);
                // For certain bits counts, also test randbits<Bits> and compare.
                uint64_t gen2;
                if (bits == 0) {
                    gen2 = ctx_test2.randbits<0>();
                } else if (bits == 1) {
                    gen2 = ctx_test2.randbits<1>();
                } else if (bits == 7) {
                    gen2 = ctx_test2.randbits<7>();
                } else if (bits == 32) {
                    gen2 = ctx_test2.randbits<32>();
                } else if (bits == 51) {
                    gen2 = ctx_test2.randbits<51>();
                } else if (bits == 64) {
                    gen2 = ctx_test2.randbits<64>();
                } else {
                    gen2 = ctx_test2.randbits(bits);
                }
                BOOST_CHECK_EQUAL(gen, gen2);
                // Make sure the result is in range.
                if (bits < 64) BOOST_CHECK_EQUAL(gen >> bits, 0);
                // Mark all the seen bits in the output.
                for (int bit = 0; bit < bits; ++bit) {
                    int idx = bit + (bits * (bits - 1)) / 2 + 2080 * ctx_test_bitsleft;
                    seen[idx].first += 1;
                    seen[idx].second += (gen >> bit) & 1;
                }
                // Update ctx_test_bitself.
                if (bits > ctx_test_bitsleft) {
                    ctx_test_bitsleft = ctx_test_bitsleft + 64 - bits;
                } else {
                    ctx_test_bitsleft -= bits;
                }
            }
            // Loop until every bit position/combination is seen 242 times.
            if (std::all_of(seen.begin(), seen.end(), [](const auto& x) { return x.first >= 242; })) break;
        }
        // Check that each bit appears within 7.78 standard deviations of 50%
        // (each will fail with P < 1/(2080 * 64 * 10^9)).
        for (const auto& val : seen) {
             assert(fabs(val.first * 0.5 - val.second) < sqrt(val.first * 0.25) * 7.78);
        }
    }
}